

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShortcutsWindow.cpp
# Opt level: O1

void __thiscall cursespp::ShortcutsWindow::SetActive(ShortcutsWindow *this,string *key)

{
  std::__cxx11::string::_M_assign((string *)&this->activeKey);
  std::__cxx11::string::_M_replace
            ((ulong)&this->originalKey,0,(char *)(this->originalKey)._M_string_length,0x188174);
  (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[5])(this);
  return;
}

Assistant:

void ShortcutsWindow::SetActive(const std::string& key) {
    this->activeKey = key;
    this->originalKey = "";
    this->Redraw();
}